

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primecandidate.c
# Opt level: O2

void pcs_require_residue(PrimeCandidateSource *s,mp_int *mod,mp_int *res_orig)

{
  uint uVar1;
  mp_int *n;
  mp_int *pmVar2;
  mp_int *pmVar3;
  mp_int *pmVar4;
  mp_int *pmVar5;
  mp_int *x;
  mp_int *y;
  mp_int *a;
  
  n = mp_mod(res_orig,mod);
  pmVar2 = mp_gcd(mod,s->factor);
  pmVar3 = mp_mod(s->addend,pmVar2);
  pmVar4 = mp_mod(n,pmVar2);
  uVar1 = mp_cmp_eq(pmVar3,pmVar4);
  if (uVar1 == 0) {
    __assert_fail("mp_cmp_eq(test1, test2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/primecandidate.c"
                  ,0x7c,"void pcs_require_residue_inner(PrimeCandidateSource *, mp_int *, mp_int *)"
                 );
  }
  mp_free(pmVar3);
  mp_free(pmVar4);
  pmVar3 = mp_div(s->factor,pmVar2);
  pmVar4 = mp_div(mod,pmVar2);
  pmVar5 = mp_modsub(n,s->addend,mod);
  x = mp_div(pmVar5,pmVar2);
  y = mp_invert(pmVar3,pmVar4);
  a = mp_modmul(x,y,pmVar4);
  mp_free(pmVar2);
  mp_free(pmVar5);
  mp_free(y);
  mp_free(pmVar3);
  mp_free(x);
  uVar1 = mp_cmp_hs(a,s->limit);
  if (uVar1 == 0) {
    pmVar2 = mp_add(s->limit,pmVar4);
    mp_sub_integer_into(pmVar2,pmVar2,1);
    mp_sub_into(pmVar2,pmVar2,a);
    mp_free(s->limit);
    pmVar3 = mp_div(pmVar2,pmVar4);
    s->limit = pmVar3;
    mp_free(pmVar2);
    pmVar2 = s->addend;
    pmVar3 = mp_mul(s->factor,a);
    pmVar5 = mp_add(s->addend,pmVar3);
    s->addend = pmVar5;
    mp_free(pmVar3);
    mp_free(pmVar2);
    pmVar2 = s->factor;
    pmVar3 = mp_mul(pmVar2,pmVar4);
    s->factor = pmVar3;
    mp_free(pmVar2);
    mp_free(pmVar4);
    mp_free(a);
    pmVar2 = mp_unsafe_shrink(s->factor);
    s->factor = pmVar2;
    pmVar2 = mp_unsafe_shrink(s->addend);
    s->addend = pmVar2;
    pmVar2 = mp_unsafe_shrink(s->limit);
    s->limit = pmVar2;
    mp_free(n);
    return;
  }
  __assert_fail("!mp_cmp_hs(K, s->limit)",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/primecandidate.c"
                ,0xaf,"void pcs_require_residue_inner(PrimeCandidateSource *, mp_int *, mp_int *)");
}

Assistant:

void pcs_require_residue(PrimeCandidateSource *s,
                         mp_int *mod, mp_int *res_orig)
{
    /*
     * Reduce the input residue to its least non-negative value, in
     * case it was given as a larger equivalent value.
     */
    mp_int *res_reduced = mp_mod(res_orig, mod);
    pcs_require_residue_inner(s, mod, res_reduced);
    mp_free(res_reduced);
}